

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,ifstream *in)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  reference local_2848;
  char buffer [10240];
  
  memset(this,0,0x2800);
  std::istream::seekg((long)in,0x20);
  std::istream::read((char *)in,(long)buffer);
  uVar3 = 0;
  for (lVar5 = 0; lVar5 != 0x2800; lVar5 = lVar5 + 1) {
    cVar1 = buffer[lVar5];
    iVar2 = (int)uVar3;
    lVar4 = 0;
    while( true ) {
      uVar3 = iVar2 + lVar4;
      if ((uint)lVar4 == 8) break;
      local_2848._M_wp = (this->bits).super__Base_bitset<1280UL>._M_w + (uVar3 >> 6);
      local_2848._M_bpos = (size_t)((uint)uVar3 & 0x3f);
      std::bitset<81920UL>::reference::operator=
                (&local_2848,((uint)(int)cVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0);
      lVar4 = lVar4 + 1;
    }
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(ifstream &in) {
  in.seekg(32, ifstream::beg);
  char buffer[10240];
  in.read(buffer, 10240);
  int p = 0;
  for (char c : buffer) {
    for (int i = 0; i < 8; i++) bits[p++] = (c >> i) & 1;
  }
}